

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_parser_t * mpc_count(int n,mpc_fold_t f,mpc_parser_t *a,mpc_dtor_t da)

{
  mpc_parser_t *pmVar1;
  
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->type = '\x16';
  (pmVar1->data).repeat.n = n;
  (pmVar1->data).repeat.f = f;
  (pmVar1->data).repeat.x = a;
  (pmVar1->data).repeat.dx = da;
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_count(int n, mpc_fold_t f, mpc_parser_t *a, mpc_dtor_t da) {
  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_COUNT;
  p->data.repeat.n = n;
  p->data.repeat.f = f;
  p->data.repeat.x = a;
  p->data.repeat.dx = da;
  return p;
}